

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDemiterToDual(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Vec_Int_t *p_00;
  Vec_Int_t *vNodes_00;
  int *pNodes;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  Gia_Obj_t *pGVar7;
  bool bVar8;
  Vec_Int_t *vOrder;
  Vec_Int_t *vNodes;
  Gia_Obj_t *pGStack_28;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Gia_Man_t *p_local;
  
  p_00 = Gia_ManCollectTopXors(p);
  if (p_00 == (Vec_Int_t *)0x0) {
    printf("Cannot demiter because the top-most gate is an AND-gate.\n");
    p_local = (Gia_Man_t *)0x0;
  }
  else {
    iVar1 = Vec_IntSize(p_00);
    if (iVar1 % 2 != 0) {
      __assert_fail("Vec_IntSize(vOrder) % 2 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                    ,0x11a4,"Gia_Man_t *Gia_ManDemiterToDual(Gia_Man_t *)");
    }
    iVar1 = Gia_ManObjNum(p);
    vNodes_00 = Vec_IntAlloc(iVar1);
    Gia_ManIncrementTravId(p);
    pNodes = Vec_IntArray(p_00);
    iVar1 = Vec_IntSize(p_00);
    Gia_ManCollectAnds(p,pNodes,iVar1,vNodes_00,(Vec_Int_t *)0x0);
    iVar1 = Gia_ManCiNum(p);
    iVar2 = Vec_IntSize(vNodes_00);
    iVar3 = Vec_IntSize(p_00);
    p_local = Gia_ManStart(iVar1 + 1 + iVar2 + iVar3);
    pcVar5 = Abc_UtilStrsav(p->pName);
    p_local->pName = pcVar5;
    pcVar5 = Abc_UtilStrsav(p->pSpec);
    p_local->pSpec = pcVar5;
    pGVar6 = Gia_ManConst0(p);
    pGVar6->Value = 0;
    vNodes._4_4_ = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCis);
      bVar8 = false;
      if (vNodes._4_4_ < iVar1) {
        pGStack_28 = Gia_ManCi(p,vNodes._4_4_);
        bVar8 = pGStack_28 != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) break;
      uVar4 = Gia_ManAppendCi(p_local);
      pGStack_28->Value = uVar4;
      vNodes._4_4_ = vNodes._4_4_ + 1;
    }
    vNodes._4_4_ = 0;
    while( true ) {
      iVar1 = Vec_IntSize(vNodes_00);
      bVar8 = false;
      if (vNodes._4_4_ < iVar1) {
        iVar1 = Vec_IntEntry(vNodes_00,vNodes._4_4_);
        pGStack_28 = Gia_ManObj(p,iVar1);
        bVar8 = pGStack_28 != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) break;
      iVar1 = Gia_ObjFanin0Copy(pGStack_28);
      iVar2 = Gia_ObjFanin1Copy(pGStack_28);
      uVar4 = Gia_ManAppendAnd(p_local,iVar1,iVar2);
      pGStack_28->Value = uVar4;
      vNodes._4_4_ = vNodes._4_4_ + 1;
    }
    pGStack_28 = Gia_ManCo(p,0);
    pGVar6 = Gia_ObjFanin0(pGStack_28);
    pGVar7 = Gia_ManConst0(p);
    if (pGVar6 == pGVar7) {
      Gia_ManAppendCo(p_local,0);
      iVar1 = Gia_ObjFaninC0(pGStack_28);
      Gia_ManAppendCo(p_local,iVar1);
    }
    else {
      Gia_ManSetPhase(p);
      vNodes._4_4_ = 0;
      while( true ) {
        iVar1 = Vec_IntSize(p_00);
        bVar8 = false;
        if (vNodes._4_4_ < iVar1) {
          iVar1 = Vec_IntEntry(p_00,vNodes._4_4_);
          pGStack_28 = Gia_ManObj(p,iVar1);
          bVar8 = pGStack_28 != (Gia_Obj_t *)0x0;
        }
        if (!bVar8) break;
        iVar1 = Abc_LitNotCond(pGStack_28->Value,(uint)((ulong)*(undefined8 *)pGStack_28 >> 0x3f));
        Gia_ManAppendCo(p_local,iVar1);
        vNodes._4_4_ = vNodes._4_4_ + 1;
      }
    }
    Vec_IntFree(vNodes_00);
    Vec_IntFree(p_00);
  }
  return p_local;
}

Assistant:

Gia_Man_t * Gia_ManDemiterToDual( Gia_Man_t * p )
{
    Gia_Man_t * pNew; Gia_Obj_t * pObj; int i;
    Vec_Int_t * vNodes;
    Vec_Int_t * vOrder = Gia_ManCollectTopXors( p );
    if ( vOrder == NULL )
    {
        printf( "Cannot demiter because the top-most gate is an AND-gate.\n" );
        return NULL;
    }
    assert( Vec_IntSize(vOrder) % 2 == 0 );
    vNodes = Vec_IntAlloc( Gia_ManObjNum(p) );
    Gia_ManIncrementTravId( p );
    Gia_ManCollectAnds( p, Vec_IntArray(vOrder), Vec_IntSize(vOrder), vNodes, NULL );
    pNew = Gia_ManStart( 1 + Gia_ManCiNum(p) + Vec_IntSize(vNodes) + Vec_IntSize(vOrder) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    pObj = Gia_ManCo(p, 0);
    if ( Gia_ObjFanin0(pObj) == Gia_ManConst0(p) )
    {
        Gia_ManAppendCo( pNew, 0 );
        Gia_ManAppendCo( pNew, Gia_ObjFaninC0(pObj) );
    }
    else
    {
        Gia_ManSetPhase( p );
        Gia_ManForEachObjVec( vOrder, p, pObj, i )
            Gia_ManAppendCo( pNew, Abc_LitNotCond(pObj->Value, pObj->fPhase) );
    }
    Vec_IntFree( vNodes );
    Vec_IntFree( vOrder );
    return pNew;
}